

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int loop_licm(gen_ctx_t gen_ctx,loop_node_t_conflict loop)

{
  void **ppvVar1;
  char cVar2;
  bb_insn_t_conflict bb_insn;
  FILE *__s;
  bb_insn_t pbVar3;
  VARR_size_t *pVVar4;
  bitmap_t pVVar5;
  uint *puVar6;
  int iVar7;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar8;
  void *pvVar9;
  gen_ctx *pgVar10;
  ulong uVar11;
  long *plVar12;
  uint uVar13;
  gen_ctx *pgVar14;
  MIR_insn_t pMVar15;
  MIR_insn_t pMVar16;
  ulong uVar17;
  bb_insn_t pbVar18;
  DLIST_LINK_bb_insn_t *pDVar19;
  gen_ctx *extraout_RDX;
  bitmap_t extraout_RDX_00;
  uint *extraout_RDX_01;
  ulong uVar20;
  gen_ctx *unaff_RBP;
  undefined8 *puVar21;
  MIR_context_t pMVar22;
  ulong uVar23;
  MIR_context_t pMVar24;
  char *pcVar25;
  gen_ctx *ctx;
  gen_ctx *gen_ctx_00;
  bb_insn_t_conflict bb_insn_00;
  gen_ctx *unaff_R13;
  long lVar26;
  gen_ctx *pgVar27;
  ulong nop;
  bool bVar28;
  int iStack_128;
  MIR_reg_t MStack_124;
  ulong uStack_120;
  insn_var_iterator_t iStack_118;
  gen_ctx_t pgStack_f8;
  bb_insn_t_conflict pbStack_f0;
  gen_ctx *pgStack_e8;
  loop_node_t_conflict plStack_e0;
  gen_ctx *pgStack_d8;
  gen_ctx *pgStack_d0;
  code *pcStack_c8;
  code *pcStack_c0;
  gen_ctx *local_b0;
  gen_ctx *local_a8;
  int local_9c;
  gen_ctx *local_98;
  gen_ctx *local_90;
  MIR_context_t local_88;
  gen_ctx *local_80;
  bb_insn_t_conflict local_78;
  undefined1 local_6c [20];
  MIR_insn_t_conflict local_58;
  bb_insn_t_conflict local_50;
  MIR_op_t *local_48;
  long *local_40;
  MIR_context_t local_38;
  
  local_b0 = (gen_ctx *)gen_ctx->temp_bitmap;
  pgVar14 = (gen_ctx *)gen_ctx->temp_bitmap2;
  bb_insn_00 = (bb_insn_t_conflict)gen_ctx->temp_bb_insns;
  pgVar10 = (gen_ctx *)(loop->children).head;
  pcVar25 = (char *)loop;
  local_90 = pgVar14;
  if (pgVar10 == (gen_ctx *)0x0) {
    local_9c = 0;
  }
  else {
    bVar28 = true;
    unaff_RBP = (gen_ctx *)&DAT_00000001;
    local_9c = 0;
    do {
      while (*(c2mir_ctx **)&pgVar10->optimize_level == (c2mir_ctx *)0x0) {
        pcStack_c0 = (code *)0x168556;
        pcVar25 = (char *)pgVar10;
        iVar7 = loop_licm(gen_ctx,(loop_node_t_conflict)pgVar10);
        pgVar10 = (gen_ctx *)pgVar10->addr_regs;
        if (iVar7 != 0) {
          local_9c = 1;
        }
        bVar28 = false;
        if (pgVar10 == (gen_ctx *)0x0) {
          return local_9c;
        }
      }
      pgVar10 = (gen_ctx *)pgVar10->addr_regs;
    } while (pgVar10 != (gen_ctx *)0x0);
    if (!bVar28) {
      return local_9c;
    }
  }
  pgVar10 = (gen_ctx *)0x0;
  if (gen_ctx->curr_cfg->root_loop_node == loop) {
    return local_9c;
  }
  if ((loop->u).preheader == (loop_node_t)0x0) {
    return local_9c;
  }
  ctx = (gen_ctx *)gen_ctx->debug_file;
  if ((ctx != (gen_ctx *)0x0) && (1 < gen_ctx->debug_level)) {
    pcVar25 = "Processing Loop%3lu for loop invariant motion:\n";
    pcStack_c0 = (code *)0x1685c0;
    fprintf((FILE *)ctx,"Processing Loop%3lu for loop invariant motion:\n",(ulong)loop->index);
  }
  pgVar27 = local_b0;
  if ((bb_insn_00 == (bb_insn_t_conflict)0x0) || (*(long *)&bb_insn_00->mem_index == 0)) {
LAB_00168f2f:
    pcStack_c0 = (code *)0x168f34;
    loop_licm_cold_12();
    gen_ctx_00 = ctx;
LAB_00168f34:
    pcStack_c0 = (code *)0x168f39;
    loop_licm_cold_11();
  }
  else {
    bb_insn_00->insn = (MIR_insn_t)0x0;
    gen_ctx_00 = ctx;
    if ((local_b0 == (gen_ctx *)0x0) || (local_b0->curr_func_item == (MIR_item_t)0x0))
    goto LAB_00168f34;
    local_b0->ctx = (MIR_context_t)0x0;
    pgVar10 = (gen_ctx *)(loop->children).head;
    local_78 = bb_insn_00;
    if (pgVar10 == (gen_ctx *)0x0) {
LAB_00168897:
      unaff_RBP = (gen_ctx *)0x0;
    }
    else {
      do {
        local_a8 = pgVar10;
        if (*(c2mir_ctx **)&pgVar10->optimize_level != (c2mir_ctx *)0x0) {
          for (puVar21 = *(undefined8 **)(*(c2mir_ctx **)&pgVar10->optimize_level + 0x50);
              puVar21 != (undefined8 *)0x0; puVar21 = (undefined8 *)puVar21[5]) {
            pgVar14 = (gen_ctx *)0x0;
            pcStack_c0 = (code *)0x168644;
            pcVar25 = (char *)loop;
            ctx = gen_ctx;
            iVar7 = loop_invariant_p(gen_ctx,loop,(bb_insn_t_conflict)*puVar21,(bitmap_t)0x0);
            if (iVar7 != 0) {
              pvVar9 = *(void **)&bb_insn_00->mem_index;
              if (pvVar9 == (void *)0x0) goto LAB_00168ece;
              pMVar16 = bb_insn_00->insn;
              pMVar15 = (MIR_insn_t)((long)&pMVar16->data + 1);
              if (*(MIR_insn_t *)&bb_insn_00->gvn_val_const_p < pMVar15) {
                lVar26 = (long)pMVar15->ops + (((ulong)pMVar15 >> 1) - 0x20);
                pcStack_c0 = (code *)0x16867e;
                pvVar9 = realloc(pvVar9,lVar26 * 8);
                *(void **)&bb_insn_00->mem_index = pvVar9;
                *(long *)&bb_insn_00->gvn_val_const_p = lVar26;
                pMVar16 = bb_insn_00->insn;
                pMVar15 = (MIR_insn_t)((long)&pMVar16->data + 1);
              }
              bb_insn_00->insn = pMVar15;
              *(undefined8 **)((long)pvVar9 + (long)pMVar16 * 8) = puVar21;
              uVar13 = *(uint *)((long)puVar21 + 0xc);
              unaff_R13 = (gen_ctx *)(ulong)uVar13;
              pcVar25 = (char *)((long)&unaff_R13->ctx + 1);
              pcStack_c0 = (code *)0x1686a8;
              ctx = pgVar27;
              bitmap_expand((bitmap_t)pgVar27,(size_t)pcVar25);
              pgVar14 = (gen_ctx *)(ulong)(uVar13 >> 6);
              ppvVar1 = &pgVar27->curr_func_item->data + (long)pgVar14;
              *ppvVar1 = (void *)((ulong)*ppvVar1 | 1L << ((ulong)unaff_R13 & 0x3f));
            }
          }
        }
        pgVar10 = (gen_ctx *)local_a8->addr_regs;
      } while (pgVar10 != (gen_ctx *)0x0);
      if (bb_insn_00->insn == (MIR_insn_t)0x0) goto LAB_00168897;
      pgVar14 = (gen_ctx *)0x0;
      pgVar10 = local_b0;
      do {
        if (*(long *)&bb_insn_00->mem_index == 0) goto LAB_00168efc;
        local_a8 = (gen_ctx *)**(undefined8 **)(*(long *)&bb_insn_00->mem_index + (long)pgVar14 * 8)
        ;
        local_98 = (gen_ctx *)((ulong)local_a8->debug_file >> 0x20);
        local_80 = pgVar14;
        if (local_98 != (gen_ctx *)0x0) {
          pgVar14 = (gen_ctx *)0x0;
          local_88 = (MIR_context_t)&local_a8->debug_level;
          do {
            while( true ) {
              ctx = (gen_ctx *)gen_ctx->ctx;
              pcStack_c0 = (code *)0x168747;
              pcVar25 = (char *)local_a8;
              MIR_insn_op_mode((MIR_context_t)ctx,(MIR_insn_t_conflict)local_a8,(size_t)pgVar14,
                               (int *)local_6c);
              if (local_6c._0_4_ != 0) break;
LAB_0016876f:
              pgVar14 = (gen_ctx *)((long)&pgVar14->ctx + 1);
              if (local_98 <= pgVar14) goto LAB_00168880;
            }
            cVar2 = *(char *)&((DLIST_LINK_MIR_insn_t *)&local_88->c2mir_ctx)[(long)pgVar14 * 3].
                              prev;
            if (cVar2 != '\x02') {
              if (cVar2 == '\v') goto LAB_0016876f;
              goto LAB_00168ed3;
            }
            for (pgVar27 = (&local_88->gen_ctx)[(long)(int)pgVar14 * 6]; pgVar27 != (gen_ctx *)0x0;
                pgVar27 = *(gen_ctx **)&pgVar27->debug_level) {
              pcStack_c0 = (code *)0x1687ab;
              pcVar25 = (char *)loop;
              ctx = gen_ctx;
              iVar7 = loop_invariant_p(gen_ctx,loop,(bb_insn_t_conflict)pgVar27->ctx->gen_ctx,
                                       (bitmap_t)pgVar10);
              if (iVar7 != 0) {
                uVar13 = *(uint *)((long)&pgVar27->ctx->c2mir_ctx + 4);
                uVar23 = (ulong)uVar13;
                pcStack_c0 = (code *)0x1687c9;
                ctx = local_b0;
                bitmap_expand((bitmap_t)local_b0,uVar23 + 1);
                uVar13 = uVar13 >> 6;
                pvVar9 = (&local_b0->curr_func_item->data)[uVar13];
                pcVar25 = (char *)((ulong)pvVar9 | 1L << (uVar23 & 0x3f));
                (&local_b0->curr_func_item->data)[uVar13] = pcVar25;
                pgVar10 = local_b0;
                if (((ulong)pvVar9 >> (uVar23 & 0x3f) & 1) == 0) {
                  pgVar10 = *(gen_ctx **)&bb_insn_00->mem_index;
                  if (pgVar10 == (gen_ctx *)0x0) {
                    pcStack_c0 = (code *)0x168ece;
                    loop_licm_cold_2();
                    goto LAB_00168ece;
                  }
                  pMVar16 = bb_insn_00->insn;
                  pMVar22 = pgVar27->ctx;
                  pMVar15 = (MIR_insn_t)((long)&pMVar16->data + 1);
                  if (*(MIR_insn_t *)&bb_insn_00->gvn_val_const_p < pMVar15) {
                    lVar26 = (long)pMVar15->ops + (((ulong)pMVar15 >> 1) - 0x20);
                    pcVar25 = (char *)(lVar26 * 8);
                    pcStack_c0 = (code *)0x168832;
                    ctx = pgVar10;
                    pgVar10 = (gen_ctx *)realloc(pgVar10,(size_t)pcVar25);
                    *(gen_ctx **)&local_78->mem_index = pgVar10;
                    *(long *)&local_78->gvn_val_const_p = lVar26;
                    pMVar16 = local_78->insn;
                    pMVar15 = (MIR_insn_t)((long)&pMVar16->data + 1);
                    bb_insn_00 = local_78;
                  }
                  bb_insn_00->insn = pMVar15;
                  pgVar10->call_used_hard_regs[(long)&pMVar16[-1].ops[0].u.reg + 0x13] =
                       (bitmap_t)pMVar22;
                  pgVar10 = local_b0;
                }
              }
            }
            pgVar14 = (gen_ctx *)((long)&pgVar14->ctx + 1);
          } while (pgVar14 < local_98);
        }
LAB_00168880:
        unaff_R13 = (gen_ctx *)local_6c;
        unaff_RBP = (gen_ctx *)bb_insn_00->insn;
        pgVar14 = (gen_ctx *)((long)&local_80->ctx + 1);
      } while (pgVar14 < unaff_RBP);
    }
    gen_ctx_00 = ctx;
    pgVar10 = local_90;
    if ((local_90 != (gen_ctx *)0x0) && (local_90->curr_func_item != (MIR_item_t)0x0)) {
      local_90->ctx = (MIR_context_t)0x0;
      if (0 < (int)(uint)unaff_RBP) {
        pMVar22 = (MIR_context_t)(ulong)((uint)unaff_RBP & 0x7fffffff);
        do {
          if ((*(long *)&bb_insn_00->mem_index == 0) ||
             (pMVar24 = (MIR_context_t)((long)&pMVar22[-1].wrapper_end_addr + 7),
             (MIR_context_t)bb_insn_00->insn <= pMVar24)) {
            pcStack_c0 = (code *)0x168ef7;
            loop_licm_cold_9();
            goto LAB_00168ef7;
          }
          bb_insn = *(bb_insn_t_conflict *)(*(long *)&bb_insn_00->mem_index + (long)pMVar24 * 8);
          local_a8 = (gen_ctx *)bb_insn->insn;
          if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
            pcStack_c0 = (code *)0x168919;
            fwrite("  Considering invariant ",0x18,1,(FILE *)gen_ctx->debug_file);
            pcStack_c0 = (code *)0x168926;
            print_bb_insn(gen_ctx,bb_insn,0);
            pgVar10 = local_90;
          }
          pgVar14 = local_b0;
          uVar13 = bb_insn->index;
          if (((ulong)uVar13 < (ulong)((long)pgVar10->ctx << 6)) &&
             (((ulong)(&pgVar10->curr_func_item->data)[uVar13 >> 6] >> ((ulong)uVar13 & 0x3f) & 1)
              != 0)) {
            if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
              pcStack_c0 = (code *)0x16897d;
              fwrite("     -- already marked as moved\n",0x20,1,(FILE *)gen_ctx->debug_file);
            }
          }
          else {
            local_88 = pMVar24;
            if (((uint)local_a8->debug_file & 0xfffffffe) == 0x2c) {
              if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                pcStack_c0 = (code *)0x1689c7;
                fwrite("     -- marked as moved becuase it is costly\n",0x2d,1,
                       (FILE *)gen_ctx->debug_file);
              }
              pgVar10 = local_90;
              pcStack_c0 = (code *)0x1689dd;
              mark_as_moved(gen_ctx,bb_insn,(bitmap_t)pgVar14,(bitmap_t)local_90);
              pMVar24 = local_88;
            }
            else {
              uVar23 = (ulong)local_a8->debug_file >> 0x20;
              pgVar10 = (gen_ctx *)0x0;
              local_50 = bb_insn;
              local_38 = pMVar22;
              if (uVar23 != 0) {
                uVar20 = 0;
                nop = 0;
                local_98 = (gen_ctx *)&local_a8->debug_level;
                pgVar10 = (gen_ctx *)0x0;
LAB_00168a1b:
                do {
                  local_80 = pgVar10;
                  pcStack_c0 = (code *)0x168a30;
                  MIR_insn_op_mode(gen_ctx->ctx,(MIR_insn_t_conflict)local_a8,nop,
                                   (int *)(local_6c + 4));
                  if ((local_6c._4_4_ == 0) ||
                     (uVar11 = uVar20,
                     *(char *)(local_98->call_used_hard_regs + nop * 6 + -0xc) == '\v')) {
                    if (uVar20 < 2) {
                      uVar17 = uVar20;
                      do {
                        if (*(char *)(local_98->call_used_hard_regs + nop * 6 + -0xc) != '\v') {
                          if (uVar20 != 1) {
                            uVar11 = 0;
                            uVar17 = uVar20;
                            if (*(char *)(local_98->call_used_hard_regs + nop * 6 + -0xc) != '\x02')
                            goto LAB_00168a94;
LAB_00168aab:
                            if ((_IO_FILE *)local_98->call_used_hard_regs[(long)(int)nop * 6 + -0xd]
                                == (_IO_FILE *)0x0) goto LAB_00168b36;
                            plVar12 = (long *)((_IO_FILE *)
                                              local_98->call_used_hard_regs
                                              [(long)(int)nop * 6 + -0xd])->_IO_read_ptr;
                            uVar20 = (ulong)*(uint *)((long)plVar12 + 0xc);
                            if ((((ulong)((long)local_b0->ctx << 6) <= uVar20) ||
                                (uVar13 = *(uint *)((long)plVar12 + 0xc) >> 6,
                                ((ulong)(&local_b0->curr_func_item->data)[uVar13] >> (uVar20 & 0x3f)
                                & 1) == 0)) ||
                               ((uVar20 < (ulong)((long)local_90->ctx << 6) &&
                                (((ulong)(&local_90->curr_func_item->data)[uVar13] &
                                 1L << (uVar20 & 0x3f)) != 0)))) goto LAB_00168b36;
                            local_58 = (MIR_insn_t_conflict)*plVar12;
                            local_6c._12_8_ = *(ulong *)&local_58->field_0x18 >> 0x20;
                            if ((gen_ctx *)local_6c._12_8_ == (gen_ctx *)0x0) goto LAB_00168b36;
                            pgVar10 = (gen_ctx *)0x0;
                            local_48 = local_58->ops;
                            local_40 = plVar12;
                            goto LAB_00168b61;
                          }
                          break;
                        }
                        if (*(int *)((long)local_98->call_used_hard_regs +
                                    (ulong)(uVar17 != 0) * 4 + nop * 0x30 + -0x48) != -1)
                        goto LAB_00168aab;
                        bVar28 = uVar17 == 0;
                        uVar17 = 1;
                      } while (bVar28);
                    }
                    uVar11 = 0;
                  }
LAB_00168a94:
                  nop = nop + 1;
                  pgVar10 = local_80;
                  uVar20 = uVar11;
                } while (nop < uVar23);
              }
LAB_00168c1c:
              iVar7 = (int)pgVar10;
              bVar28 = true;
LAB_00168c1f:
              pMVar22 = local_38;
              __s = (FILE *)gen_ctx->debug_file;
              if ((__s != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                if (iVar7 == 0) {
                  pcStack_c0 = (code *)0x168cba;
                  fwrite("     -- can\'t be moved because single insn\n",0x2b,1,__s);
                  pMVar24 = local_88;
                  pgVar10 = local_90;
                  goto LAB_00168c98;
                }
                pcVar25 = "can\'t";
                if (bVar28) {
                  pcVar25 = "can";
                }
                pcStack_c0 = (code *)0x168c68;
                fprintf(__s,"     -- %s be moved because reg presure consideration\n",pcVar25);
              }
              pMVar24 = local_88;
              pgVar10 = local_90;
              if (bVar28 && iVar7 != 0) {
                pcStack_c0 = (code *)0x168c98;
                mark_as_moved(gen_ctx,local_50,(bitmap_t)local_b0,(bitmap_t)local_90);
              }
            }
          }
LAB_00168c98:
          bVar28 = 1 < (long)pMVar22;
          pMVar22 = pMVar24;
        } while (bVar28);
        unaff_RBP = (gen_ctx *)bb_insn_00->insn;
      }
      if (unaff_RBP != (gen_ctx *)0x0) {
        unaff_R13 = (gen_ctx *)0x0;
        do {
          if (*(long *)&bb_insn_00->mem_index == 0) {
LAB_00168ef7:
            pcStack_c0 = (code *)0x168efc;
            loop_licm_cold_8();
LAB_00168efc:
            pcStack_c0 = (code *)0x168f01;
            loop_licm_cold_3();
LAB_00168f01:
            pcStack_c0 = (code *)0x168f20;
            __assert_fail("before != ((void*)0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x14d2,"void licm_move_insn(gen_ctx_t, bb_insn_t, bb_t, bb_insn_t)");
          }
          bb_insn_00 = *(bb_insn_t_conflict *)
                        (*(long *)&bb_insn_00->mem_index + (long)unaff_R13 * 8);
          uVar13 = bb_insn_00->index;
          if (((ulong)uVar13 < (ulong)((long)local_90->ctx << 6)) &&
             (((ulong)(&local_90->curr_func_item->data)[uVar13 >> 6] >> ((ulong)uVar13 & 0x3f) & 1)
              != 0)) {
            if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
              pcStack_c0 = (code *)0x168d4b;
              fprintf((FILE *)gen_ctx->debug_file,"  Move invariant (target bb%lu) %-5lu",
                      ((loop->u).preheader)->bb->index);
              pcStack_c0 = (code *)0x168d58;
              print_bb_insn(gen_ctx,bb_insn_00,0);
            }
            pgVar10 = (gen_ctx *)(loop->entry->bb->bb_insns).head;
            if (pgVar10 == (gen_ctx *)0x0) goto LAB_00168f01;
            pMVar22 = gen_ctx->ctx;
            pcVar25 = (char *)bb_insn_00->insn;
            pgVar14 = (gen_ctx *)bb_insn_00->bb;
            ctx = (gen_ctx *)((loop->u).preheader)->bb;
            pbVar3 = (bb_insn_00->bb_insn_link).prev;
            pgVar27 = (gen_ctx *)ctx->temp_bitmap2;
            if (pbVar3 == (bb_insn_t)0x0) {
              if ((bb_insn_t_conflict)((MIR_module *)&pgVar14->temp_bitmap)->data == bb_insn_00) {
                pbVar18 = (bb_insn_00->bb_insn_link).next;
                ((MIR_module *)&pgVar14->temp_bitmap)->data = pbVar18;
                goto LAB_00168dad;
              }
LAB_00168f25:
              pcStack_c0 = (code *)0x168f2a;
              loop_licm_cold_4();
            }
            else {
              pbVar18 = (bb_insn_00->bb_insn_link).next;
              (pbVar3->bb_insn_link).next = pbVar18;
LAB_00168dad:
              local_b0 = pgVar27;
              local_88 = pMVar22;
              if (pbVar18 != (bb_insn_t)0x0) {
                pDVar19 = &pbVar18->bb_insn_link;
LAB_00168dd3:
                pDVar19->prev = pbVar3;
                unaff_RBP = (gen_ctx *)&ctx->temp_bitmap;
                (bb_insn_00->bb_insn_link).prev = (bb_insn_t)0x0;
                (bb_insn_00->bb_insn_link).next = (bb_insn_t)0x0;
                gen_ctx_00 = (gen_ctx *)&((gen_ctx->curr_func_item->u).func)->insns;
                pcStack_c0 = (code *)0x168e02;
                local_a8 = ctx;
                local_98 = (gen_ctx *)pcVar25;
                DLIST_MIR_insn_t_remove((DLIST_MIR_insn_t *)gen_ctx_00,(MIR_insn_t)pcVar25);
                pgVar14 = local_b0;
                if ((local_b0 == (gen_ctx *)0x0) || (local_b0->ctx->func_redef_permission_p != 0x76)
                   ) {
                  pbVar3 = (bb_insn_t)local_a8->temp_bitmap2;
                  pgVar14 = local_98;
                  pcVar25 = (char *)local_b0;
                  if (pbVar3 == (bb_insn_t)0x0) {
                    if ((char *)((MIR_module *)unaff_RBP)->data != (char *)0x0) goto LAB_00168f3e;
                  }
                  else {
                    if ((pbVar3->bb_insn_link).next != (bb_insn_t)0x0) {
                      pcStack_c0 = (code *)0x168f25;
                      loop_licm_cold_6();
                      ctx = gen_ctx_00;
                      goto LAB_00168f25;
                    }
                    unaff_RBP = (gen_ctx *)&(pbVar3->bb_insn_link).next;
                  }
                  ((MIR_module *)unaff_RBP)->data = bb_insn_00;
                  (bb_insn_00->bb_insn_link).next = (bb_insn_t)0x0;
                  (bb_insn_00->bb_insn_link).prev = pbVar3;
                  local_a8->temp_bitmap2 = (bitmap_t)bb_insn_00;
                }
                else {
                  pcStack_c0 = (code *)0x168e23;
                  DLIST_bb_insn_t_insert_before
                            ((DLIST_bb_insn_t *)unaff_RBP,(bb_insn_t_conflict)local_b0,bb_insn_00);
                  pgVar10 = pgVar14;
                }
                pgVar14 = local_a8;
                pcStack_c0 = (code *)0x168e8d;
                MIR_insert_insn_before
                          (local_88,gen_ctx->curr_func_item,(MIR_insn_t_conflict)pgVar10->ctx,
                           (MIR_insn_t_conflict)local_98);
                bb_insn_00->bb = (bb_t_conflict)pgVar14;
                local_9c = 1;
                unaff_RBP = (gen_ctx *)local_78->insn;
                goto LAB_00168ea2;
              }
              if ((bb_insn_t_conflict)pgVar14->temp_bitmap2 == bb_insn_00) {
                pDVar19 = (DLIST_LINK_bb_insn_t *)&pgVar14->temp_bitmap2;
                goto LAB_00168dd3;
              }
            }
            pcStack_c0 = (code *)0x168f2f;
            loop_licm_cold_5();
            goto LAB_00168f2f;
          }
LAB_00168ea2:
          unaff_R13 = (gen_ctx *)((long)&unaff_R13->ctx + 1);
          bb_insn_00 = local_78;
        } while (unaff_R13 < unaff_RBP);
      }
      return local_9c;
    }
  }
  pcStack_c0 = (code *)0x168f3e;
  loop_licm_cold_10();
LAB_00168f3e:
  pcStack_c0 = DLIST_bb_t_insert_before;
  loop_licm_cold_7();
  if (((gen_ctx_00 == (gen_ctx *)0x0) || ((gen_ctx *)pcVar25 == (gen_ctx *)0x0)) ||
     (*(c2mir_ctx **)&gen_ctx_00->optimize_level == (c2mir_ctx *)0x0)) {
    pcStack_c8 = (code *)0x168f97;
    DLIST_bb_t_insert_before_cold_3();
LAB_00168f97:
    pcStack_c8 = (code *)0x168f9c;
    DLIST_bb_t_insert_before_cold_1();
  }
  else {
    pVVar4 = *(VARR_size_t **)&((gen_ctx *)pcVar25)->debug_level;
    pgVar14 = (gen_ctx *)gen_ctx_00->ctx;
    if (pVVar4 != (VARR_size_t *)0x0) {
      if (pgVar14 != (gen_ctx *)0x0) {
        pVVar4[1].varr = (size_t *)extraout_RDX;
        *(VARR_size_t **)&extraout_RDX->debug_level = pVVar4;
        *(gen_ctx **)&((gen_ctx *)pcVar25)->debug_level = extraout_RDX;
        extraout_RDX->to_free = (VARR_void_ptr_t *)pcVar25;
        return extraout_EAX;
      }
      goto LAB_00168f97;
    }
    if (pgVar14 == (gen_ctx *)pcVar25) {
      *(gen_ctx **)&((gen_ctx *)pcVar25)->debug_level = extraout_RDX;
      extraout_RDX->to_free = (VARR_void_ptr_t *)pcVar25;
      *(undefined8 *)&extraout_RDX->debug_level = 0;
      gen_ctx_00->ctx = (MIR_context_t)extraout_RDX;
      return extraout_EAX;
    }
  }
  pcStack_c8 = DLIST_loop_node_t_insert_after;
  DLIST_bb_t_insert_before_cold_2();
  if (((gen_ctx_00 == (gen_ctx *)0x0) || ((gen_ctx *)pcVar25 == (gen_ctx *)0x0)) ||
     ((gen_ctx *)gen_ctx_00->ctx == (gen_ctx *)0x0)) {
    pgStack_d0 = (gen_ctx *)0x168ff6;
    DLIST_loop_node_t_insert_after_cold_3();
  }
  else {
    pVVar5 = ((gen_ctx *)pcVar25)->addr_regs;
    pgVar14 = *(gen_ctx **)&gen_ctx_00->optimize_level;
    if (pVVar5 == (bitmap_t)0x0) {
      if (pgVar14 == (gen_ctx *)pcVar25) {
        ((gen_ctx *)pcVar25)->addr_regs = extraout_RDX_00;
        extraout_RDX_00[2].size = (size_t)pcVar25;
        extraout_RDX_00[2].varr = (bitmap_el_t *)0x0;
        *(bitmap_t *)&gen_ctx_00->optimize_level = extraout_RDX_00;
        return extraout_EAX_00;
      }
      goto LAB_00168ffb;
    }
    if (pgVar14 != (gen_ctx *)0x0) {
      pVVar5[2].size = (size_t)extraout_RDX_00;
      extraout_RDX_00[2].varr = &pVVar5->els_num;
      ((gen_ctx *)pcVar25)->addr_regs = extraout_RDX_00;
      extraout_RDX_00[2].size = (size_t)pcVar25;
      return extraout_EAX_00;
    }
  }
  pgStack_d0 = (gen_ctx *)0x168ffb;
  DLIST_loop_node_t_insert_after_cold_1();
LAB_00168ffb:
  pgStack_d0 = (gen_ctx *)loop_invariant_p;
  DLIST_loop_node_t_insert_after_cold_2();
  uVar23 = *(ulong *)(extraout_RDX_01 + 6);
  iVar8 = 0;
  uVar13 = (uint)uVar23;
  iVar7 = 0;
  if ((((uVar13 - 0xa5 < 0xffffffd1) &&
       ((iVar7 = iVar8, 0x14 < uVar13 - 0xa6 || ((0x104071U >> (uVar13 - 0xa6 & 0x1f) & 1) == 0))))
      && (uVar13 - 0xaa < 0xfffffffd)) &&
     (((0x3b < uVar13 || ((0xf1e000000000000U >> (uVar23 & 0x3f) & 1) == 0)) && (6 < uVar13 - 0xad))
     )) {
    pgStack_f8 = gen_ctx;
    pbStack_f0 = bb_insn_00;
    pgStack_e8 = unaff_R13;
    plStack_e0 = loop;
    pgStack_d8 = pgVar10;
    pgStack_d0 = unaff_RBP;
    if (uVar23 >> 0x20 == 0) {
      iStack_118.nops = 0;
    }
    else {
      uVar20 = 0;
      puVar6 = extraout_RDX_01;
      do {
        if ((char)puVar6[10] == '\x02') {
          uStack_120 = uVar20;
          iVar7 = bitmap_bit_p(gen_ctx_00->tied_regs,(ulong)puVar6[0xc]);
          if (iVar7 != 0) {
            return 0;
          }
          uVar23 = *(ulong *)(extraout_RDX_01 + 6);
          uVar20 = uStack_120;
        }
        else if ((char)puVar6[10] == '\v') {
          return 0;
        }
        uVar20 = uVar20 + 1;
        iStack_118.nops = uVar23 >> 0x20;
        puVar6 = puVar6 + 0xc;
      } while (uVar20 < iStack_118.nops);
    }
    iStack_118.op_num = 0;
    iStack_118.op_part_num = 0;
    iVar8 = input_insn_var_iterator_next(gen_ctx_00,&iStack_118,&MStack_124,&iStack_128);
    iVar7 = 1;
    if (iVar8 != 0) {
      do {
        if (*(long *)(extraout_RDX_01 + (long)iStack_128 * 0xc + 8) == 0) {
          __assert_fail("se != ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x14bf,"int loop_invariant_p(gen_ctx_t, loop_node_t, bb_insn_t, bitmap_t)")
          ;
        }
        lVar26 = *(long *)(*(long *)(extraout_RDX_01 + (long)iStack_128 * 0xc + 8) + 8);
        if (pgVar14 == (gen_ctx *)0x0) {
LAB_00169157:
          pgVar10 = (gen_ctx *)pcVar25;
          do {
            pgVar10 = (gen_ctx *)pgVar10->debug_file;
            if (pgVar10 == (gen_ctx *)0x0) {
              return 0;
            }
          } while (pgVar10 != *(gen_ctx **)(*(long *)(*(long *)(lVar26 + 0x30) + 0x98) + 0x18));
        }
        else {
          uVar13 = *(uint *)(lVar26 + 0xc);
          if (((ulong)((long)pgVar14->ctx << 6) <= (ulong)uVar13) ||
             (((ulong)(&pgVar14->curr_func_item->data)[uVar13 >> 6] >> ((ulong)uVar13 & 0x3f) & 1)
              == 0)) goto LAB_00169157;
        }
        iVar8 = input_insn_var_iterator_next(gen_ctx_00,&iStack_118,&MStack_124,&iStack_128);
      } while (iVar8 != 0);
    }
  }
  return iVar7;
  while (pgVar10 = (gen_ctx *)((long)&local_80->ctx + 1), pgVar10 < (ulong)local_6c._12_8_) {
LAB_00168b61:
    pcStack_c0 = (code *)0x168b78;
    local_80 = pgVar10;
    MIR_insn_op_mode(gen_ctx->ctx,local_58,(size_t)pgVar10,(int *)(local_6c + 8));
    if (local_6c._8_4_ != 0) {
      if (local_48[(long)local_80].field_0x8 == '\x02') {
        plVar12 = *(long **)(*local_40 + 0x20 + (long)(int)local_80 * 0x30);
        if (plVar12 != (long *)0x0) {
          do {
            uVar13 = *(uint *)(*plVar12 + 0xc);
            if (((ulong)((long)local_b0->ctx << 6) <= (ulong)uVar13) ||
               (((ulong)(&local_b0->curr_func_item->data)[uVar13 >> 6] >> ((ulong)uVar13 & 0x3f) & 1
                ) == 0)) {
              bVar28 = false;
              iVar7 = 1;
              goto LAB_00168c1f;
            }
            plVar12 = (long *)plVar12[4];
          } while (plVar12 != (long *)0x0);
        }
      }
      else if (local_48[(long)local_80].field_0x8 != '\v') goto LAB_00168ed3;
    }
  }
LAB_00168b36:
  uVar20 = uVar17 + 1;
  pgVar10 = (gen_ctx *)&DAT_00000001;
  if (uVar23 <= nop) goto LAB_00168c1c;
  goto LAB_00168a1b;
LAB_00168ece:
  pcStack_c0 = (code *)0x168ed3;
  loop_licm_cold_1();
LAB_00168ed3:
  pcStack_c0 = (code *)0x168ef2;
  __assert_fail("op_ref->mode == MIR_OP_VAR",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x4ff,
                "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
               );
}

Assistant:

static int loop_licm (gen_ctx_t gen_ctx, loop_node_t loop) {
  MIR_insn_t insn;
  bb_insn_t bb_insn;
  loop_node_t node;
  int subloop_p = FALSE, move_p = FALSE, op_num;
  MIR_reg_t var;
  ssa_edge_t se;
  insn_var_iterator_t iter;
  bitmap_t loop_invariant_bb_insn_bitmap = temp_bitmap;
  bitmap_t bb_insns_to_move_bitmap = temp_bitmap2;
  VARR (bb_insn_t) *loop_invariant_bb_insns = temp_bb_insns;

  for (node = DLIST_HEAD (loop_node_t, loop->children); node != NULL;
       node = DLIST_NEXT (loop_node_t, node))
    if (node->bb == NULL) {
      subloop_p = TRUE;
      if (loop_licm (gen_ctx, node)) move_p = TRUE; /* process sub-loops first */
    }
  if (subloop_p || curr_cfg->root_loop_node == loop || loop->u.preheader == NULL)
    return move_p; /* e.g. root or unreachable root */
  DEBUG (2, {
    fprintf (debug_file, "Processing Loop%3lu for loop invariant motion:\n",
             (unsigned long) loop->index);
  });
  VARR_TRUNC (bb_insn_t, loop_invariant_bb_insns, 0);
  bitmap_clear (loop_invariant_bb_insn_bitmap);
  for (node = DLIST_HEAD (loop_node_t, loop->children); node != NULL;
       node = DLIST_NEXT (loop_node_t, node)) {
    if (node->bb == NULL) continue; /* skip subloops */
    for (bb_insn = DLIST_HEAD (bb_insn_t, node->bb->bb_insns); bb_insn != NULL;
         bb_insn = DLIST_NEXT (bb_insn_t, bb_insn))
      if (loop_invariant_p (gen_ctx, loop, bb_insn, NULL)) { /* Push start invariants */
        VARR_PUSH (bb_insn_t, loop_invariant_bb_insns, bb_insn);
        bitmap_set_bit_p (loop_invariant_bb_insn_bitmap, bb_insn->index);
      }
  }
  for (size_t i = 0; i < VARR_LENGTH (bb_insn_t, loop_invariant_bb_insns); i++) {
    /* Add insns becoming invariant if we move its inputs: */
    bb_insn = VARR_GET (bb_insn_t, loop_invariant_bb_insns, i);
    insn = bb_insn->insn;
    FOREACH_OUT_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
      for (se = insn->ops[op_num].data; se != NULL; se = se->next_use) {
        if (loop_invariant_p (gen_ctx, loop, se->use, loop_invariant_bb_insn_bitmap)
            && bitmap_set_bit_p (loop_invariant_bb_insn_bitmap, se->use->index))
          VARR_PUSH (bb_insn_t, loop_invariant_bb_insns, se->use);
      }
    }
  }
  bitmap_clear (bb_insns_to_move_bitmap);
  for (int i = (int) VARR_LENGTH (bb_insn_t, loop_invariant_bb_insns) - 1; i >= 0; i--) {
    bb_insn = VARR_GET (bb_insn_t, loop_invariant_bb_insns, i);
    insn = bb_insn->insn;
    DEBUG (2, {
      fprintf (debug_file, "  Considering invariant ");
      print_bb_insn (gen_ctx, bb_insn, FALSE);
    });
    if (bitmap_bit_p (bb_insns_to_move_bitmap, bb_insn->index)) {
      DEBUG (2, { fprintf (debug_file, "     -- already marked as moved\n"); });
      continue;
    }
    if (expensive_insn_p (insn)) {
      DEBUG (2, { fprintf (debug_file, "     -- marked as moved becuase it is costly\n"); });
      mark_as_moved (gen_ctx, bb_insn, loop_invariant_bb_insn_bitmap, bb_insns_to_move_bitmap);
      continue;
    }
    int can_be_moved = TRUE, input_var_p = FALSE;
    FOREACH_IN_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
      input_var_p = TRUE;
      if ((se = insn->ops[op_num].data) != NULL
          && bitmap_bit_p (loop_invariant_bb_insn_bitmap, se->def->index)
          && !bitmap_bit_p (bb_insns_to_move_bitmap, se->def->index)
          && non_invariant_use_p (gen_ctx, se->def, loop_invariant_bb_insn_bitmap)) {
        can_be_moved = FALSE;
        break;
      }
    }
    DEBUG (2, {
      if (input_var_p)
        fprintf (debug_file, "     -- %s be moved because reg presure consideration\n",
                 can_be_moved ? "can" : "can't");
      else
        fprintf (debug_file, "     -- can't be moved because single insn\n");
    });
    if (can_be_moved && input_var_p)
      mark_as_moved (gen_ctx, bb_insn, loop_invariant_bb_insn_bitmap, bb_insns_to_move_bitmap);
  }
  for (size_t i = 0; i < VARR_LENGTH (bb_insn_t, loop_invariant_bb_insns); i++) {
    bb_insn = VARR_GET (bb_insn_t, loop_invariant_bb_insns, i);
    if (!bitmap_bit_p (bb_insns_to_move_bitmap, bb_insn->index)) continue;
    insn = bb_insn->insn;
    DEBUG (2, {
      fprintf (debug_file, "  Move invariant (target bb%lu) %-5lu",
               (unsigned long) loop->u.preheader->bb->index, (unsigned long) bb_insn->index);
      print_bb_insn (gen_ctx, bb_insn, FALSE);
    });
    licm_move_insn (gen_ctx, bb_insn, loop->u.preheader->bb,
                    DLIST_HEAD (bb_insn_t, loop->entry->bb->bb_insns));
    move_p = TRUE;
  }
  return move_p;
}